

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_visit_crossing_edge_pairs.cc
# Opt level: O2

bool s2shapeutil::VisitCrossingEdgePairs
               (S2ShapeIndex *a_index,S2ShapeIndex *b_index,CrossingType type,
               EdgePairVisitor *visitor)

{
  ulong uVar1;
  int iVar2;
  RangeIterator *this;
  S2ShapeIndexCell *pSVar3;
  S2ShapeIndexCell *cell;
  ulong uVar4;
  RangeIterator *target;
  bool bVar5;
  RangeIterator local_f90;
  RangeIterator local_f78;
  IndexCrosser ab;
  IndexCrosser ba;
  
  RangeIterator::RangeIterator(&local_f78,a_index);
  RangeIterator::RangeIterator(&local_f90,b_index);
  anon_unknown_0::IndexCrosser::IndexCrosser(&ab,a_index,b_index,type,visitor,false);
  anon_unknown_0::IndexCrosser::IndexCrosser(&ba,b_index,a_index,type,visitor,true);
LAB_00260cc8:
  do {
    while( true ) {
      uVar1 = ((S2CellId *)
              ((long)local_f78.it_.iter_._M_t.
                     super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                     .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl + 8))
              ->id_;
      if ((uVar1 == 0xffffffffffffffff) &&
         (((S2CellId *)
          ((long)local_f90.it_.iter_._M_t.
                 super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                 .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl + 8))->id_
          == 0xffffffffffffffff)) {
        bVar5 = true;
        goto LAB_00260e09;
      }
      this = &local_f78;
      target = &local_f90;
      if ((local_f90.range_min_.id_ <= local_f78.range_max_.id_) &&
         (this = &local_f90, target = &local_f78,
         local_f78.range_min_.id_ <= local_f90.range_max_.id_)) break;
      RangeIterator::SeekTo(this,target);
    }
    uVar4 = ((S2CellId *)
            ((long)local_f90.it_.iter_._M_t.
                   super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                   .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl + 8))->
            id_;
    uVar4 = -uVar4 & uVar4;
    bVar5 = (long)((-uVar1 & uVar1) - uVar4) < 0;
    if ((-uVar1 & uVar1) == uVar4 || bVar5) {
      if (!bVar5) {
        pSVar3 = S2ShapeIndex::IteratorBase::cell
                           ((IteratorBase *)
                            local_f78.it_.iter_._M_t.
                            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl
                           );
        iVar2 = S2ShapeIndexCell::num_edges(pSVar3);
        if (0 < iVar2) {
          pSVar3 = S2ShapeIndex::IteratorBase::cell
                             ((IteratorBase *)
                              local_f90.it_.iter_._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl);
          iVar2 = S2ShapeIndexCell::num_edges(pSVar3);
          if (0 < iVar2) {
            pSVar3 = S2ShapeIndex::IteratorBase::cell
                               ((IteratorBase *)
                                local_f78.it_.iter_._M_t.
                                super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                                _M_head_impl);
            cell = S2ShapeIndex::IteratorBase::cell
                             ((IteratorBase *)
                              local_f90.it_.iter_._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl);
            GetShapeEdges(ab.a_index_,pSVar3,&ab.a_shape_edges_);
            GetShapeEdges(ab.b_index_,cell,&ab.b_shape_edges_);
            bVar5 = anon_unknown_0::IndexCrosser::VisitEdgesEdgesCrossings
                              (&ab,&ab.a_shape_edges_,&ab.b_shape_edges_);
            if (!bVar5) goto LAB_00260e07;
          }
        }
        RangeIterator::Next(&local_f78);
        RangeIterator::Next(&local_f90);
        goto LAB_00260cc8;
      }
      bVar5 = anon_unknown_0::IndexCrosser::VisitCrossings(&ba,&local_f90,&local_f78);
    }
    else {
      bVar5 = anon_unknown_0::IndexCrosser::VisitCrossings(&ab,&local_f78,&local_f90);
    }
    if (bVar5 == false) {
LAB_00260e07:
      bVar5 = false;
LAB_00260e09:
      anon_unknown_0::IndexCrosser::~IndexCrosser(&ba);
      anon_unknown_0::IndexCrosser::~IndexCrosser(&ab);
      if ((__uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           )local_f90.it_.iter_._M_t.
            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           )0x0) {
        (**(code **)(*(long *)local_f90.it_.iter_._M_t.
                              super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                              .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                              _M_head_impl + 8))();
      }
      if (local_f78.it_.iter_._M_t.
          super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          ._M_t.
          super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
          .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl !=
          (__uniq_ptr_data<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>,_true,_true>
           )0x0) {
        (*(*(_func_int ***)
            local_f78.it_.iter_._M_t.
            super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            ._M_t.
            super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
            .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl)[1])();
      }
      return bVar5;
    }
  } while( true );
}

Assistant:

bool VisitCrossingEdgePairs(const S2ShapeIndex& a_index,
                            const S2ShapeIndex& b_index,
                            CrossingType type, const EdgePairVisitor& visitor) {
  // We look for S2CellId ranges where the indexes of A and B overlap, and
  // then test those edges for crossings.

  // TODO(ericv): Use brute force if the total number of edges is small enough
  // (using a larger threshold if the S2ShapeIndex is not constructed yet).
  RangeIterator ai(a_index), bi(b_index);
  IndexCrosser ab(a_index, b_index, type, visitor, false);  // Tests A against B
  IndexCrosser ba(b_index, a_index, type, visitor, true);   // Tests B against A
  while (!ai.done() || !bi.done()) {
    if (ai.range_max() < bi.range_min()) {
      // The A and B cells don't overlap, and A precedes B.
      ai.SeekTo(bi);
    } else if (bi.range_max() < ai.range_min()) {
      // The A and B cells don't overlap, and B precedes A.
      bi.SeekTo(ai);
    } else {
      // One cell contains the other.  Determine which cell is larger.
      int64 ab_relation = ai.id().lsb() - bi.id().lsb();
      if (ab_relation > 0) {
        // A's index cell is larger.
        if (!ab.VisitCrossings(&ai, &bi)) return false;
      } else if (ab_relation < 0) {
        // B's index cell is larger.
        if (!ba.VisitCrossings(&bi, &ai)) return false;
      } else {
        // The A and B cells are the same.
        if (ai.cell().num_edges() > 0 && bi.cell().num_edges() > 0) {
          if (!ab.VisitCellCellCrossings(ai.cell(), bi.cell())) return false;
        }
        ai.Next();
        bi.Next();
      }
    }
  }
  return true;
}